

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.hpp
# Opt level: O2

matrix_type *
nanoNet::Trainer::weightsGradientFromPrevious
          (matrix_type *__return_storage_ptr__,vector_type *bias_gradients,
          vector_type *previous_values)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  pointer pvVar5;
  long lVar6;
  long lVar7;
  size_t j;
  long lVar8;
  allocator_type local_46;
  allocator_type local_45;
  value_type_conflict local_44;
  _Vector_base<float,_std::allocator<float>_> local_40;
  
  pfVar1 = (bias_gradients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar2 = (bias_gradients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_44 = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_40,
             (long)(previous_values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(previous_values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_44,&local_45);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(__return_storage_ptr__,(long)pfVar1 - (long)pfVar2 >> 2,(value_type *)&local_40,&local_46
          );
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_40);
  pfVar1 = (bias_gradients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (bias_gradients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar3 = (previous_values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (previous_values->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar7 = 0; lVar7 != (long)pfVar2 - (long)pfVar1 >> 2; lVar7 = lVar7 + 1) {
    pvVar5 = (__return_storage_ptr__->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = 0; (long)pfVar4 - (long)pfVar3 >> 2 != lVar8; lVar8 = lVar8 + 1) {
      lVar6 = *(long *)&pvVar5[lVar7].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data;
      *(float *)(lVar6 + lVar8 * 4) = pfVar1[lVar7] * pfVar3[lVar8] + *(float *)(lVar6 + lVar8 * 4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static matrix_type weightsGradientFromPrevious(
        const vector_type& bias_gradients, const vector_type& previous_values)
    {
        matrix_type weights_gradients(
            bias_gradients.size(), vector_type(previous_values.size(), 0.0f));

        for (std::size_t i = 0; i < bias_gradients.size(); ++i)
            for (std::size_t j = 0; j < previous_values.size(); ++j)
                weights_gradients[i][j] += bias_gradients[i] * previous_values[j];

        return weights_gradients;
    }